

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_merging.h
# Opt level: O3

void __thiscall
shift_window_transformer::PatchMerging<float>::forward
          (PatchMerging<float> *this,Tensor<float> *input,Tensor<float> *output)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  pointer pfVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  int y;
  ulong uVar18;
  int iVar19;
  Tensor<float> tmp;
  int local_c8;
  int local_c4;
  ulong local_98;
  undefined1 local_78 [24];
  pointer piStack_60;
  pointer local_58;
  pointer piStack_50;
  int local_3c;
  int local_38;
  int local_34;
  
  puVar5 = (uint *)(input->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
  uVar1 = *puVar5;
  uVar2 = puVar5[1];
  uVar3 = puVar5[2];
  iVar19 = (int)uVar2 / this->downscaling_factor;
  iVar13 = (int)uVar3 / this->downscaling_factor;
  local_58 = (pointer)0x0;
  piStack_50 = (pointer)0x0;
  local_78._16_8_ = (pointer)0x0;
  piStack_60 = (pointer)0x0;
  local_78._0_8_ = (pointer)0x0;
  local_78._8_8_ = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)local_78,
             (long)(input->super_vector<float,_std::allocator<float>_>).
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_finish -
             (long)(input->super_vector<float,_std::allocator<float>_>).
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_start >> 2);
  local_34 = *(input->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start * this->downscaling_factor * this->downscaling_factor
  ;
  local_3c = iVar19;
  local_38 = iVar13;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&piStack_60,&local_3c);
  if (0 < (int)uVar1) {
    iVar8 = 0;
    local_c4 = 1;
    uVar10 = 0;
    do {
      if (0 < iVar19) {
        uVar4 = this->downscaling_factor;
        uVar15 = (ulong)uVar4;
        local_98 = (ulong)(uVar4 * uVar4 * local_c4);
        iVar9 = 0;
        local_c8 = iVar8;
        do {
          if (0 < iVar13) {
            iVar14 = 0;
            uVar11 = local_98;
            iVar12 = local_c8;
            do {
              if (0 < (int)uVar4) {
                pfVar6 = (input->super_vector<float,_std::allocator<float>_>).
                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start;
                uVar16 = 0;
                uVar17 = uVar11;
                iVar7 = iVar12;
                do {
                  uVar18 = 0;
                  do {
                    *(float *)(local_78._0_8_ + (long)((int)uVar17 + (int)uVar18) * 4) =
                         pfVar6[(long)iVar7 + uVar18];
                    uVar18 = uVar18 + 1;
                  } while (uVar15 != uVar18);
                  uVar16 = uVar16 + 1;
                  iVar7 = iVar7 + uVar3;
                  uVar17 = uVar17 + uVar15;
                } while (uVar16 != uVar15);
              }
              iVar14 = iVar14 + 1;
              iVar12 = iVar12 + uVar4;
              uVar11 = uVar11 + uVar1;
            } while (iVar14 != iVar13);
          }
          iVar9 = iVar9 + 1;
          local_c8 = local_c8 + uVar3 * uVar4;
          local_98 = local_98 + uVar1 * iVar13 * uVar4 * uVar4;
        } while (iVar9 != iVar19);
      }
      uVar10 = uVar10 + 1;
      iVar8 = iVar8 + uVar2 * uVar3;
      local_c4 = local_c4 + 1;
    } while (uVar10 != uVar1);
  }
  Linear<float>::forward(&this->layer,(Tensor<float> *)local_78,output);
  if (piStack_60 != (pointer)0x0) {
    operator_delete(piStack_60,(long)piStack_50 - (long)piStack_60);
  }
  if ((pointer)local_78._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
  }
  return;
}

Assistant:

void forward(const Tensor<T> &input, Tensor<T> &output) {
            auto &vec = input.shape;
            int ch_sum = vec[0], h = vec[1], w = vec[2];
            int new_h = h / downscaling_factor, new_w = w / downscaling_factor;
            Tensor<T> tmp{};
            tmp.resize(input.size());
            tmp.shape = {new_h, new_w,
                         (vec[0] * downscaling_factor * downscaling_factor)};
            /*
             * Unfold and reshape
             */
            for (int ch = 0; ch < ch_sum; ++ch) {
                for (int i = 0; i < new_h; ++i) {
                    for (int j = 0; j < new_w; ++j) {
                        for (int x = 0; x < downscaling_factor; ++x) {
                            for (int y = 0; y < downscaling_factor; ++y) {
                                int new_x = ch * downscaling_factor * downscaling_factor + x * downscaling_factor + y;
                                int new_y = i * new_w + j;
                                int tmp_pos = new_x * new_w * new_h + new_y;
                                // Input: C, H, W
                                // Tmp: H*W/(downscaling_size^2), C * downscaling_size^2
                                tmp[i * ch_sum * downscaling_factor * downscaling_factor * new_w + j * ch_sum +
                                    downscaling_factor * downscaling_factor +
                                    ch * downscaling_factor * downscaling_factor + x * downscaling_factor + y] = input[
                                        ch * h * w + (i * downscaling_factor + x) * w + j * downscaling_factor + y];
                            }
                        }
                    }
                }
            }
            layer.forward(tmp, output);
        }